

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

FaceHandle __thiscall
OpenMesh::PolyConnectivity::add_face
          (PolyConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  uint uVar1;
  HalfedgeHandle _heh;
  ulong __new_size;
  bool bVar2;
  BaseHandle _fh;
  size_type sVar3;
  mostream *pmVar4;
  reference pvVar5;
  reference pvVar6;
  bool local_1a2;
  BaseHandle local_17c;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_178;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_170;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_168;
  BaseHandle local_160;
  BaseHandle local_15c;
  BaseHandle local_158;
  BaseHandle local_154;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_150;
  BaseHandle local_148;
  BaseHandle local_144;
  BaseHandle local_140;
  BaseHandle local_13c;
  BaseHandle local_138;
  BaseHandle local_134;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_130;
  BaseHandle local_128;
  BaseHandle local_124;
  BaseHandle local_120;
  BaseHandle local_11c;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_118;
  BaseHandle local_110;
  BaseHandle local_10c;
  BaseHandle local_108;
  BaseHandle local_104;
  BaseHandle local_100;
  BaseHandle local_fc;
  ulong local_f8;
  size_t id;
  BaseHandle local_e8;
  BaseHandle local_e4;
  BaseHandle local_e0;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_dc;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_d4;
  pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle> local_cc;
  BaseHandle local_c4;
  BaseHandle local_c0;
  BaseHandle local_bc;
  BaseHandle local_b8;
  BaseHandle local_b4;
  BaseHandle local_b0;
  BaseHandle local_ac;
  BaseHandle local_a8;
  BaseHandle local_a4;
  BaseHandle local_a0;
  BaseHandle local_9c;
  BaseHandle local_98;
  BaseHandle local_94;
  BaseHandle local_90;
  BaseHandle local_8c;
  BaseHandle local_88;
  BaseHandle local_84;
  BaseHandle local_80;
  BaseHandle local_7c;
  BaseHandle local_78;
  BaseHandle local_74;
  BaseHandle local_70;
  BaseHandle local_6c;
  BaseHandle local_68;
  BaseHandle local_64;
  HalfedgeHandle patch_end;
  HalfedgeHandle patch_start;
  HalfedgeHandle boundary_prev;
  HalfedgeHandle boundary_next;
  HalfedgeHandle outer_prev;
  HalfedgeHandle outer_next;
  HalfedgeHandle inner_prev;
  HalfedgeHandle inner_next;
  size_t n;
  size_t ii;
  size_t i;
  size_t sStack_28;
  VertexHandle vh;
  size_t _vhs_size_local;
  VertexHandle *_vertex_handles_local;
  PolyConnectivity *this_local;
  FaceHandle fh;
  
  sStack_28 = _vhs_size;
  VertexHandle::VertexHandle((VertexHandle *)((long)&i + 4),-1);
  __new_size = sStack_28;
  HalfedgeHandle::HalfedgeHandle(&outer_next,-1);
  HalfedgeHandle::HalfedgeHandle(&outer_prev,-1);
  HalfedgeHandle::HalfedgeHandle(&boundary_next,-1);
  HalfedgeHandle::HalfedgeHandle(&boundary_prev,-1);
  HalfedgeHandle::HalfedgeHandle(&patch_start,-1);
  HalfedgeHandle::HalfedgeHandle(&patch_end,-1);
  HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_64,-1);
  HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_68,-1);
  sVar3 = std::
          vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
          ::size(&this->edgeData_);
  if (sVar3 < __new_size) {
    std::
    vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ::resize(&this->edgeData_,__new_size);
    std::
    vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
    ::resize(&this->next_cache_,__new_size * 6);
  }
  this->next_cache_count_ = 0;
  if (__new_size < 3) {
    __assert_fail("n > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x86,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                 );
  }
  n = 1;
  for (ii = 0; ii < __new_size; ii = ii + 1) {
    local_6c.idx_ = _vertex_handles[ii].super_BaseHandle.idx_;
    bVar2 = is_boundary(this,(VertexHandle)local_6c.idx_);
    if (!bVar2) {
      pmVar4 = omerr();
      std::operator<<(&pmVar4->super_ostream,"PolyMeshT::add_face: complex vertex\n");
      return (FaceHandle)(BaseHandle)InvalidFaceHandle.idx_;
    }
    local_74.idx_ = _vertex_handles[ii].super_BaseHandle.idx_;
    local_78.idx_ = _vertex_handles[n].super_BaseHandle.idx_;
    local_70.idx_ = (int)find_halfedge(this,local_74.idx_,local_78.idx_);
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    (pvVar5->halfedge_handle).super_BaseHandle.idx_ = local_70.idx_;
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    bVar2 = BaseHandle::is_valid((BaseHandle *)pvVar5);
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    pvVar5->is_new = (bool)((bVar2 ^ 0xffU) & 1);
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    pvVar5->needs_adjust = false;
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    if ((pvVar5->is_new & 1U) == 0) {
      pvVar5 = std::
               vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
               ::operator[](&this->edgeData_,ii);
      local_7c.idx_ = (pvVar5->halfedge_handle).super_BaseHandle.idx_;
      bVar2 = is_boundary(this,(HalfedgeHandle)local_7c.idx_);
      if (!bVar2) {
        pmVar4 = omerr();
        std::operator<<(&pmVar4->super_ostream,"PolyMeshT::add_face: complex edge\n");
        return (FaceHandle)(BaseHandle)InvalidFaceHandle.idx_;
      }
    }
    n = (n + 1) % __new_size;
  }
  ii = 0;
  n = 1;
  do {
    if (__new_size <= ii) {
      n = 1;
      for (ii = 0; ii < __new_size; ii = ii + 1) {
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,ii);
        if ((pvVar5->is_new & 1U) != 0) {
          local_e4.idx_ = _vertex_handles[ii].super_BaseHandle.idx_;
          local_e8.idx_ = _vertex_handles[n].super_BaseHandle.idx_;
          local_e0.idx_ =
               (int)ArrayKernel::new_edge(&this->super_ArrayKernel,local_e4.idx_,local_e8.idx_);
          pvVar5 = std::
                   vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                   ::operator[](&this->edgeData_,ii);
          (pvVar5->halfedge_handle).super_BaseHandle.idx_ = local_e0.idx_;
        }
        n = (n + 1) % __new_size;
      }
      _fh.idx_ = (int)ArrayKernel::new_face(&this->super_ArrayKernel);
      id._4_4_ = _fh.idx_;
      pvVar5 = std::
               vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
               ::operator[](&this->edgeData_,__new_size - 1);
      id._0_4_ = (pvVar5->halfedge_handle).super_BaseHandle.idx_;
      ArrayKernel::set_halfedge_handle
                (&this->super_ArrayKernel,(FaceHandle)id._4_4_,(HalfedgeHandle)id._0_4_);
      ii = 0;
      n = 1;
      do {
        if (__new_size <= ii) {
          for (ii = 0; ii < this->next_cache_count_; ii = ii + 1) {
            pvVar6 = std::
                     vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ::operator[](&this->next_cache_,ii);
            _heh.super_BaseHandle.idx_ = (BaseHandle)(pvVar6->first).super_BaseHandle.idx_;
            pvVar6 = std::
                     vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ::operator[](&this->next_cache_,ii);
            ArrayKernel::set_next_halfedge_handle
                      (&this->super_ArrayKernel,_heh,
                       (HalfedgeHandle)(pvVar6->second).super_BaseHandle.idx_);
          }
          for (ii = 0; ii < __new_size; ii = ii + 1) {
            pvVar5 = std::
                     vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                     ::operator[](&this->edgeData_,ii);
            if ((pvVar5->needs_adjust & 1U) != 0) {
              adjust_outgoing_halfedge(this,(VertexHandle)_vertex_handles[ii].super_BaseHandle.idx_)
              ;
            }
          }
          return (BaseHandle)(BaseHandle)_fh.idx_;
        }
        i._4_4_ = _vertex_handles[n].super_BaseHandle.idx_;
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,ii);
        outer_prev.super_BaseHandle.idx_ =
             (BaseHandle)(pvVar5->halfedge_handle).super_BaseHandle.idx_;
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,n);
        outer_next.super_BaseHandle.idx_ =
             (BaseHandle)(pvVar5->halfedge_handle).super_BaseHandle.idx_;
        bVar2 = BaseHandle::is_valid(&outer_prev.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("inner_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xe1,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&outer_next.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("inner_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xe2,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        local_f8 = 0;
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,ii);
        if ((pvVar5->is_new & 1U) != 0) {
          local_f8 = local_f8 | 1;
        }
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,n);
        if ((pvVar5->is_new & 1U) != 0) {
          local_f8 = local_f8 | 2;
        }
        if (local_f8 == 0) {
          local_17c.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,i._4_4_);
          bVar2 = BaseHandle::operator==(&local_17c,&outer_next.super_BaseHandle);
          pvVar5 = std::
                   vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                   ::operator[](&this->edgeData_,n);
          pvVar5->needs_adjust = bVar2;
        }
        else {
          local_100 = outer_next.super_BaseHandle.idx_;
          local_fc.idx_ =
               (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,outer_next);
          local_108 = outer_prev.super_BaseHandle.idx_;
          boundary_prev.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_fc.idx_;
          local_104.idx_ =
               (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,outer_prev);
          boundary_next.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_104.idx_;
          bVar2 = BaseHandle::is_valid(&boundary_prev.super_BaseHandle);
          if (!bVar2) {
            __assert_fail("outer_prev.is_valid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                          ,0xed,
                          "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                         );
          }
          bVar2 = BaseHandle::is_valid(&boundary_next.super_BaseHandle);
          if (!bVar2) {
            __assert_fail("outer_next.is_valid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                          ,0xee,
                          "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                         );
          }
          if (local_f8 == 1) {
            local_110 = outer_next.super_BaseHandle.idx_;
            local_10c.idx_ =
                 (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,outer_next);
            patch_end.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_10c.idx_;
            bVar2 = BaseHandle::is_valid(&patch_end.super_BaseHandle);
            if (!bVar2) {
              __assert_fail("boundary_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xf5,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            local_118 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                  (&patch_end,&boundary_next);
            uVar1 = this->next_cache_count_;
            this->next_cache_count_ = uVar1 + 1;
            pvVar6 = std::
                     vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ::operator[](&this->next_cache_,(ulong)uVar1);
            std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                      (pvVar6,&local_118);
            local_11c.idx_ = i._4_4_;
            local_120 = boundary_next.super_BaseHandle.idx_;
            ArrayKernel::set_halfedge_handle
                      (&this->super_ArrayKernel,(VertexHandle)i._4_4_,boundary_next);
          }
          else if (local_f8 == 2) {
            local_128 = outer_prev.super_BaseHandle.idx_;
            local_124.idx_ =
                 (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,outer_prev);
            patch_start.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_124.idx_;
            bVar2 = BaseHandle::is_valid(&patch_start.super_BaseHandle);
            if (!bVar2) {
              __assert_fail("boundary_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xfc,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            local_130 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                  (&boundary_prev,&patch_start);
            uVar1 = this->next_cache_count_;
            this->next_cache_count_ = uVar1 + 1;
            pvVar6 = std::
                     vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ::operator[](&this->next_cache_,(ulong)uVar1);
            std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                      (pvVar6,&local_130);
            local_134.idx_ = i._4_4_;
            local_138 = patch_start.super_BaseHandle.idx_;
            ArrayKernel::set_halfedge_handle
                      (&this->super_ArrayKernel,(VertexHandle)i._4_4_,patch_start);
          }
          else if (local_f8 == 3) {
            local_140.idx_ = i._4_4_;
            local_13c.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,i._4_4_);
            bVar2 = BaseHandle::is_valid(&local_13c);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              local_158.idx_ = i._4_4_;
              local_160.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,i._4_4_);
              local_154.idx_ = local_160.idx_;
              patch_start.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_160.idx_;
              local_15c.idx_ =
                   (int)ArrayKernel::prev_halfedge_handle
                                  (&this->super_ArrayKernel,(HalfedgeHandle)local_160.idx_);
              patch_end.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_15c.idx_;
              bVar2 = BaseHandle::is_valid(&patch_end.super_BaseHandle);
              if (!bVar2) {
                __assert_fail("boundary_prev.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0x10b,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              bVar2 = BaseHandle::is_valid(&patch_start.super_BaseHandle);
              if (!bVar2) {
                __assert_fail("boundary_next.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0x10c,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              local_168 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                    (&patch_end,&boundary_next);
              uVar1 = this->next_cache_count_;
              this->next_cache_count_ = uVar1 + 1;
              pvVar6 = std::
                       vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ::operator[](&this->next_cache_,(ulong)uVar1);
              std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                        (pvVar6,&local_168);
              local_170 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                    (&boundary_prev,&patch_start);
              uVar1 = this->next_cache_count_;
              this->next_cache_count_ = uVar1 + 1;
              pvVar6 = std::
                       vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ::operator[](&this->next_cache_,(ulong)uVar1);
              std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                        (pvVar6,&local_170);
            }
            else {
              local_144.idx_ = i._4_4_;
              local_148 = boundary_next.super_BaseHandle.idx_;
              ArrayKernel::set_halfedge_handle
                        (&this->super_ArrayKernel,(VertexHandle)i._4_4_,boundary_next);
              local_150 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                    (&boundary_prev,&boundary_next);
              uVar1 = this->next_cache_count_;
              this->next_cache_count_ = uVar1 + 1;
              pvVar6 = std::
                       vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ::operator[](&this->next_cache_,(ulong)uVar1);
              std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                        (pvVar6,&local_150);
            }
          }
          local_178 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                                (&outer_prev,&outer_next);
          uVar1 = this->next_cache_count_;
          this->next_cache_count_ = uVar1 + 1;
          pvVar6 = std::
                   vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                   ::operator[](&this->next_cache_,(ulong)uVar1);
          std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=
                    (pvVar6,&local_178);
        }
        pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,ii);
        ArrayKernel::set_face_handle
                  (&this->super_ArrayKernel,
                   (HalfedgeHandle)(pvVar5->halfedge_handle).super_BaseHandle.idx_,
                   (FaceHandle)_fh.idx_);
        ii = ii + 1;
        n = (n + 1) % __new_size;
      } while( true );
    }
    pvVar5 = std::
             vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
             ::operator[](&this->edgeData_,ii);
    if (((pvVar5->is_new & 1U) == 0) &&
       (pvVar5 = std::
                 vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                 ::operator[](&this->edgeData_,n), (pvVar5->is_new & 1U) == 0)) {
      pvVar5 = std::
               vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
               ::operator[](&this->edgeData_,ii);
      outer_prev.super_BaseHandle.idx_ = (BaseHandle)(pvVar5->halfedge_handle).super_BaseHandle.idx_
      ;
      pvVar5 = std::
               vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
               ::operator[](&this->edgeData_,n);
      outer_next.super_BaseHandle.idx_ = (BaseHandle)(pvVar5->halfedge_handle).super_BaseHandle.idx_
      ;
      local_84 = outer_prev.super_BaseHandle.idx_;
      local_80.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,outer_prev);
      bVar2 = BaseHandle::operator!=(&local_80,&outer_next.super_BaseHandle);
      if (bVar2) {
        local_8c = outer_next.super_BaseHandle.idx_;
        local_88.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,outer_next);
        local_94 = outer_prev.super_BaseHandle.idx_;
        boundary_prev.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_88.idx_;
        local_90.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,outer_prev);
        patch_end = boundary_prev;
        boundary_next.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_90.idx_;
        do {
          local_a0 = patch_end.super_BaseHandle.idx_;
          local_9c.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,patch_end)
          ;
          local_a4.idx_ =
               (int)ArrayKernel::opposite_halfedge_handle
                              (&this->super_ArrayKernel,(HalfedgeHandle)local_9c.idx_);
          local_98.idx_ = local_a4.idx_;
          patch_end.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_a4.idx_;
          bVar2 = is_boundary(this,(HalfedgeHandle)local_a4.idx_);
          local_1a2 = true;
          if (bVar2) {
            local_1a2 = BaseHandle::operator==
                                  (&patch_end.super_BaseHandle,&outer_prev.super_BaseHandle);
          }
        } while (local_1a2 != false);
        local_ac = patch_end.super_BaseHandle.idx_;
        local_a8.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,patch_end);
        local_b0 = patch_end.super_BaseHandle.idx_;
        patch_start.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_a8.idx_;
        bVar2 = is_boundary(this,patch_end);
        if (!bVar2) {
          __assert_fail("is_boundary(boundary_prev)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xb5,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        local_b4 = patch_start.super_BaseHandle.idx_;
        bVar2 = is_boundary(this,patch_start);
        if (!bVar2) {
          __assert_fail("is_boundary(boundary_next)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xb6,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::operator==(&patch_start.super_BaseHandle,&outer_next.super_BaseHandle);
        if (bVar2) {
          pmVar4 = omerr();
          std::operator<<(&pmVar4->super_ostream,"PolyMeshT::add_face: patch re-linking failed\n");
          return (FaceHandle)(BaseHandle)InvalidFaceHandle.idx_;
        }
        local_bc = outer_prev.super_BaseHandle.idx_;
        local_b8.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,outer_prev);
        local_c4 = outer_next.super_BaseHandle.idx_;
        local_64.idx_ = local_b8.idx_;
        local_c0.idx_ = (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,outer_next);
        local_68.idx_ = local_c0.idx_;
        bVar2 = BaseHandle::is_valid(&patch_end.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("boundary_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc2,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&local_64);
        if (!bVar2) {
          __assert_fail("patch_start.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc3,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&local_68);
        if (!bVar2) {
          __assert_fail("patch_end.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc4,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&patch_start.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("boundary_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc5,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&outer_prev.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("inner_prev.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0xc6,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        bVar2 = BaseHandle::is_valid(&outer_next.super_BaseHandle);
        if (!bVar2) {
          __assert_fail("inner_next.is_valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,199,
                        "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                       );
        }
        local_cc = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                             (&patch_end,(HalfedgeHandle *)&local_64);
        uVar1 = this->next_cache_count_;
        this->next_cache_count_ = uVar1 + 1;
        pvVar6 = std::
                 vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ::operator[](&this->next_cache_,(ulong)uVar1);
        std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=(pvVar6,&local_cc);
        local_d4 = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                             ((HalfedgeHandle *)&local_68,&patch_start);
        uVar1 = this->next_cache_count_;
        this->next_cache_count_ = uVar1 + 1;
        pvVar6 = std::
                 vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ::operator[](&this->next_cache_,(ulong)uVar1);
        std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=(pvVar6,&local_d4);
        local_dc = std::make_pair<OpenMesh::HalfedgeHandle&,OpenMesh::HalfedgeHandle&>
                             (&outer_prev,&outer_next);
        uVar1 = this->next_cache_count_;
        this->next_cache_count_ = uVar1 + 1;
        pvVar6 = std::
                 vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                 ::operator[](&this->next_cache_,(ulong)uVar1);
        std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>::operator=(pvVar6,&local_dc);
      }
    }
    ii = ii + 1;
    n = (n + 1) % __new_size;
  } while( true );
}

Assistant:

PolyConnectivity::FaceHandle
PolyConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  VertexHandle                   vh;
  size_t                         i, ii, n(_vhs_size);
  HalfedgeHandle                 inner_next, inner_prev,
                                 outer_next, outer_prev,
                                 boundary_next, boundary_prev,
                                 patch_start, patch_end;


  // Check sufficient working storage available
  if (edgeData_.size() < n)
  {
    edgeData_.resize(n);
    next_cache_.resize(6*n);
  }
  next_cache_count_ = 0;

  // don't allow degenerated faces
  assert (n > 2);

  // test for topological errors
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if ( !is_boundary(_vertex_handles[i]) )
    {
      omerr() << "PolyMeshT::add_face: complex vertex\n";
      return InvalidFaceHandle;
    }

    // Initialise edge attributes
    edgeData_[i].halfedge_handle = find_halfedge(_vertex_handles[i],
                                                 _vertex_handles[ii]);
    edgeData_[i].is_new = !edgeData_[i].halfedge_handle.is_valid();
    edgeData_[i].needs_adjust = false;

    if (!edgeData_[i].is_new && !is_boundary(edgeData_[i].halfedge_handle))
    {
      omerr() << "PolyMeshT::add_face: complex edge\n";
      return InvalidFaceHandle;
    }
  }

  // re-link patches if necessary
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if (!edgeData_[i].is_new && !edgeData_[ii].is_new)
    {
      inner_prev = edgeData_[i].halfedge_handle;
      inner_next = edgeData_[ii].halfedge_handle;


      if (next_halfedge_handle(inner_prev) != inner_next)
      {
        // here comes the ugly part... we have to relink a whole patch

        // search a free gap
        // free gap will be between boundary_prev and boundary_next
        outer_prev = opposite_halfedge_handle(inner_next);
        outer_next = opposite_halfedge_handle(inner_prev);
        boundary_prev = outer_prev;
        do
          boundary_prev =
            opposite_halfedge_handle(next_halfedge_handle(boundary_prev));
        while (!is_boundary(boundary_prev) || boundary_prev==inner_prev);
        boundary_next = next_halfedge_handle(boundary_prev);
        assert(is_boundary(boundary_prev));
        assert(is_boundary(boundary_next));
        // ok ?
        if (boundary_next == inner_next)
        {
          omerr() << "PolyMeshT::add_face: patch re-linking failed\n";
          return InvalidFaceHandle;
        }

        // other halfedges' handles
        patch_start = next_halfedge_handle(inner_prev);
        patch_end   = prev_halfedge_handle(inner_next);

        assert(boundary_prev.is_valid());
        assert(patch_start.is_valid());
        assert(patch_end.is_valid());
        assert(boundary_next.is_valid());
        assert(inner_prev.is_valid());
        assert(inner_next.is_valid());

        // relink
        next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, patch_start);
        next_cache_[next_cache_count_++] = std::make_pair(patch_end, boundary_next);
        next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
      }
    }
  }

  // create missing edges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
    if (edgeData_[i].is_new)
      edgeData_[i].halfedge_handle = new_edge(_vertex_handles[i], _vertex_handles[ii]);

  // create the face
  FaceHandle fh(new_face());
  set_halfedge_handle(fh, edgeData_[n-1].halfedge_handle);

  // setup halfedges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    vh         = _vertex_handles[ii];

    inner_prev = edgeData_[i].halfedge_handle;
    inner_next = edgeData_[ii].halfedge_handle;
    assert(inner_prev.is_valid());
    assert(inner_next.is_valid());

    size_t id = 0;
    if (edgeData_[i].is_new)  id |= 1;
    if (edgeData_[ii].is_new) id |= 2;


    if (id)
    {
      outer_prev = opposite_halfedge_handle(inner_next);
      outer_next = opposite_halfedge_handle(inner_prev);
      assert(outer_prev.is_valid());
      assert(outer_next.is_valid());

      // set outer links
      switch (id)
      {
        case 1: // prev is new, next is old
          boundary_prev = prev_halfedge_handle(inner_next);
          assert(boundary_prev.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
          set_halfedge_handle(vh, outer_next);
          break;

        case 2: // next is new, prev is old
          boundary_next = next_halfedge_handle(inner_prev);
          assert(boundary_next.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          set_halfedge_handle(vh, boundary_next);
          break;

        case 3: // both are new
          if (!halfedge_handle(vh).is_valid())
          {
            set_halfedge_handle(vh, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, outer_next);
          }
          else
          {
            boundary_next = halfedge_handle(vh);
            boundary_prev = prev_halfedge_handle(boundary_next);
            assert(boundary_prev.is_valid());
            assert(boundary_next.is_valid());
            next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          }
          break;
      }

      // set inner link
      next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
    }
    else edgeData_[ii].needs_adjust = (halfedge_handle(vh) == inner_next);


    // set face handle
    set_face_handle(edgeData_[i].halfedge_handle, fh);
  }

  // process next halfedge cache
  for (i = 0; i < next_cache_count_; ++i)
    set_next_halfedge_handle(next_cache_[i].first, next_cache_[i].second);


  // adjust vertices' halfedge handle
  for (i=0; i<n; ++i)
    if (edgeData_[i].needs_adjust)
      adjust_outgoing_halfedge(_vertex_handles[i]);

  return fh;
}